

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O2

void do_cmd_view_map(void)

{
  uint8_t uVar1;
  uint8_t uVar2;
  undefined8 in_RAX;
  wchar_t cx;
  wchar_t cy;
  
  if (Term->view_map_hook != (_func_void_term_ptr *)0x0) {
    (*Term->view_map_hook)(Term);
    return;
  }
  _cx = in_RAX;
  screen_save();
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  Term_clear();
  uVar2 = tile_width;
  uVar1 = tile_height;
  tile_width = '\x01';
  tile_height = '\x01';
  display_map(&cy,&cx);
  put_str("Hit any key to continue",Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xfffffff5');
  Term_gotoxy(cx,cy);
  anykey();
  tile_height = uVar1;
  tile_width = uVar2;
  screen_load();
  return;
}

Assistant:

void do_cmd_view_map(void)
{
	int cy, cx;
	uint8_t w, h;
	const char *prompt = "Hit any key to continue";
	if (Term->view_map_hook) {
		(*(Term->view_map_hook))(Term);
		return;
	}
	/* Save screen */
	screen_save();

	/* Note */
	prt("Please wait...", 0, 0);

	/* Flush */
	Term_fresh();

	/* Clear the screen */
	Term_clear();

	/* store the tile multipliers */
	w = tile_width;
	h = tile_height;
	tile_width = 1;
	tile_height = 1;

	/* Display the map */
	display_map(&cy, &cx);

	/* Show the prompt */
	put_str(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Highlight the player */
	Term_gotoxy(cx, cy);

	/* Get any key */
	(void)anykey();

	/* Restore the tile multipliers */
	tile_width = w;
	tile_height = h;

	/* Load screen */
	screen_load();
}